

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedOutputStreamTest.cpp
# Opt level: O2

int BufferedOutputStreamTest(int argc,char **argv)

{
  OutputBufferedStream *this;
  OutputFileStream *this_00;
  allocator<char> local_102;
  allocator<char> local_101;
  Byte buffer [5];
  string local_e0;
  string local_c0;
  string local_a0;
  FileURL local_80;
  FileURL local_60;
  FileURL local_40;
  
  this = (OutputBufferedStream *)operator_new(0x28);
  this_00 = (OutputFileStream *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"BufferedOutputStreamTest.txt",&local_102);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,argv[2],&local_101);
  PosixPath::PosixPath((PosixPath *)buffer,&local_a0);
  PosixPath::ToFileURL(&local_80,(PosixPath *)buffer);
  PosixPath::~PosixPath((PosixPath *)buffer);
  FileURL::FileURL(&local_60,&local_e0);
  FileURL::InterpretFrom(&local_40,&local_60,&local_80);
  PosixPath::PosixPath((PosixPath *)buffer);
  PosixPath::FromFileURL((PosixPath *)buffer,&local_40);
  PosixPath::ToString_abi_cxx11_(&local_c0,(PosixPath *)buffer);
  PosixPath::~PosixPath((PosixPath *)buffer);
  FileURL::~FileURL(&local_40);
  FileURL::~FileURL(&local_60);
  FileURL::~FileURL(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  OutputFileStream::OutputFileStream(this_00,&local_c0,false);
  OutputBufferedStream::OutputBufferedStream(this,(IByteWriterWithPosition *)this_00,2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  builtin_memcpy(buffer,"abcde",5);
  (*(this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[2])(this,buffer,5);
  (*(this->super_IByteWriterWithPosition).super_IByteWriter._vptr_IByteWriter[1])(this);
  return 0;
}

Assistant:

int BufferedOutputStreamTest(int argc, char* argv[])
{
	IByteWriter* stream = new OutputBufferedStream(new OutputFileStream(
                            BuildRelativeOutputPath(argv,"BufferedOutputStreamTest.txt")),2);
	Byte buffer[5] = {'a','b','c','d','e'};

	stream->Write(buffer,5);
	delete stream;

	return 0;
}